

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

group * clipp::operator&(group *__return_storage_ptr__,group *a,parameter *b)

{
  bool bVar1;
  __type_conflict _Var2;
  ulong uVar3;
  doc_string *__lhs;
  doc_string *__rhs;
  group *pgVar4;
  parameter local_1b0;
  group local_b0;
  group local_68;
  parameter *local_20;
  parameter *b_local;
  group *a_local;
  
  local_20 = b;
  b_local = (parameter *)a;
  a_local = __return_storage_ptr__;
  detail::token<clipp::parameter>::blocking(&b->super_token<clipp::parameter>,true);
  bVar1 = group::all_blocking(a);
  if ((((!bVar1) || (bVar1 = group::exclusive(a), bVar1)) ||
      (bVar1 = detail::token<clipp::group>::repeatable(&a->super_token<clipp::group>), bVar1)) ||
     (bVar1 = group::joinable(a), bVar1)) {
LAB_00107b1a:
    bVar1 = group::all_blocking(a);
    if (!bVar1) {
      group::blocking(a,true);
    }
    group::group(&local_b0,a);
    parameter::parameter(&local_1b0,b);
    group::group<clipp::parameter>(&local_68,&local_b0,&local_1b0);
    pgVar4 = group::scoped(&local_68,true);
    group::group(__return_storage_ptr__,pgVar4);
    group::~group(&local_68);
    parameter::~parameter(&local_1b0);
    group::~group(&local_b0);
  }
  else {
    detail::token<clipp::group>::doc_abi_cxx11_(&a->super_token<clipp::group>);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      __lhs = detail::token<clipp::group>::doc_abi_cxx11_(&a->super_token<clipp::group>);
      __rhs = detail::token<clipp::parameter>::doc_abi_cxx11_(&b->super_token<clipp::parameter>);
      _Var2 = std::operator==(__lhs,__rhs);
      if (!_Var2) goto LAB_00107b1a;
    }
    pgVar4 = group::push_back(a,b);
    group::group(__return_storage_ptr__,pgVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

inline group
operator & (group a, parameter b)
{
    b.blocking(true);
    if(a.all_blocking() && !a.exclusive() && !a.repeatable() && !a.joinable()
        && (a.doc().empty() || a.doc() == b.doc()))
    {
        return a.push_back(std::move(b));
    }
    else {
        if(!a.all_blocking()) a.blocking(true);
        return group{std::move(a), std::move(b)}.scoped(true);
    }
}